

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalNext(Fts3Cursor *pCsr)

{
  Fts3Expr *pExpr_00;
  int iVar1;
  bool bVar2;
  Fts3Expr *pExpr;
  Fts3Cursor *pFStack_10;
  int rc;
  Fts3Cursor *pCsr_local;
  
  pExpr._4_4_ = 0;
  pExpr_00 = pCsr->pExpr;
  pFStack_10 = pCsr;
  if (pExpr_00 == (Fts3Expr *)0x0) {
    pCsr->isEof = '\x01';
  }
  else {
    do {
      if (pFStack_10->isRequireSeek == '\0') {
        sqlite3_reset(pFStack_10->pStmt);
      }
      fts3EvalNextRow(pFStack_10,pExpr_00,(int *)((long)&pExpr + 4));
      pFStack_10->isEof = pExpr_00->bEof;
      pFStack_10->isRequireSeek = '\x01';
      pFStack_10->isMatchinfoNeeded = 1;
      pFStack_10->iPrevId = pExpr_00->iDocid;
      bVar2 = false;
      if (pFStack_10->isEof == '\0') {
        iVar1 = sqlite3Fts3EvalTestDeferred(pFStack_10,(int *)((long)&pExpr + 4));
        bVar2 = iVar1 != 0;
      }
    } while (bVar2);
  }
  if ((pExpr._4_4_ == 0) &&
     (((pFStack_10->bDesc == '\0' && (pFStack_10->iMaxDocid < pFStack_10->iPrevId)) ||
      ((pFStack_10->bDesc != '\0' && (pFStack_10->iPrevId < pFStack_10->iMinDocid)))))) {
    pFStack_10->isEof = '\x01';
  }
  return pExpr._4_4_;
}

Assistant:

static int fts3EvalNext(Fts3Cursor *pCsr){
  int rc = SQLITE_OK;             /* Return Code */
  Fts3Expr *pExpr = pCsr->pExpr;
  assert( pCsr->isEof==0 );
  if( pExpr==0 ){
    pCsr->isEof = 1;
  }else{
    do {
      if( pCsr->isRequireSeek==0 ){
        sqlite3_reset(pCsr->pStmt);
      }
      assert( sqlite3_data_count(pCsr->pStmt)==0 );
      fts3EvalNextRow(pCsr, pExpr, &rc);
      pCsr->isEof = pExpr->bEof;
      pCsr->isRequireSeek = 1;
      pCsr->isMatchinfoNeeded = 1;
      pCsr->iPrevId = pExpr->iDocid;
    }while( pCsr->isEof==0 && sqlite3Fts3EvalTestDeferred(pCsr, &rc) );
  }

  /* Check if the cursor is past the end of the docid range specified
  ** by Fts3Cursor.iMinDocid/iMaxDocid. If so, set the EOF flag.  */
  if( rc==SQLITE_OK && (
        (pCsr->bDesc==0 && pCsr->iPrevId>pCsr->iMaxDocid)
     || (pCsr->bDesc!=0 && pCsr->iPrevId<pCsr->iMinDocid)
  )){
    pCsr->isEof = 1;
  }

  return rc;
}